

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longlong value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  char_type buffer [26];
  char local_58 [40];
  
  uVar7 = -value;
  if (0 < value) {
    uVar7 = value;
  }
  lVar4 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar8 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar9 = (ulong)((uVar8 - (uVar7 < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                              (ulong)uVar8 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar11 = (sVar2 - (value >> 0x3f)) + uVar9;
  if (pbVar1->capacity_ < uVar11) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar11);
  }
  pwVar10 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar11;
  if (value < 0) {
    *pwVar10 = L'-';
    pwVar10 = pwVar10 + 1;
  }
  pcVar5 = local_58 + uVar9;
  uVar11 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar11 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar11 + (int)uVar7 * -100) * 2
            );
      pcVar5 = pcVar5 + -2;
      bVar3 = 9999 < uVar11;
      uVar11 = uVar7;
    } while (bVar3);
  }
  if (uVar7 < 10) {
    bVar6 = (byte)uVar7 | 0x30;
    lVar4 = -1;
  }
  else {
    pcVar5[-1] = internal::basic_data<void>::DIGITS[(uVar7 * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[uVar7 * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  pcVar5[lVar4] = bVar6;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      pwVar10[uVar7] = (int)local_58[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }